

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O2

void __thiscall pmx::PmxJointParam::Read(PmxJointParam *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  
  iVar1 = ReadIndex(stream,(uint)setting->rigidbody_index_size);
  this->rigid_body1 = iVar1;
  iVar1 = ReadIndex(stream,(uint)setting->rigidbody_index_size);
  this->rigid_body2 = iVar1;
  std::istream::read((char *)stream,(long)this->position);
  std::istream::read((char *)stream,(long)this->orientaiton);
  std::istream::read((char *)stream,(long)this->move_limitation_min);
  std::istream::read((char *)stream,(long)this->move_limitation_max);
  std::istream::read((char *)stream,(long)this->rotation_limitation_min);
  std::istream::read((char *)stream,(long)this->rotation_limitation_max);
  std::istream::read((char *)stream,(long)this->spring_move_coefficient);
  std::istream::read((char *)stream,(long)this->spring_rotation_coefficient);
  return;
}

Assistant:

void PmxJointParam::Read(std::istream *stream, PmxSetting *setting)
	{
		this->rigid_body1 = ReadIndex(stream, setting->rigidbody_index_size);
		this->rigid_body2 = ReadIndex(stream, setting->rigidbody_index_size);
		stream->read((char*) this->position, sizeof(float) * 3);
		stream->read((char*) this->orientaiton, sizeof(float) * 3);
		stream->read((char*) this->move_limitation_min, sizeof(float) * 3);
		stream->read((char*) this->move_limitation_max, sizeof(float) * 3);
		stream->read((char*) this->rotation_limitation_min, sizeof(float) * 3);
		stream->read((char*) this->rotation_limitation_max, sizeof(float) * 3);
		stream->read((char*) this->spring_move_coefficient, sizeof(float) * 3);
		stream->read((char*) this->spring_rotation_coefficient, sizeof(float) * 3);
	}